

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TtCountOnesInCofsFast6_rec(word Truth,int iVar,int nBytes,int *pStore)

{
  int iVar1;
  int iVar2;
  word wVar3;
  int local_34;
  int i;
  int nMints1;
  int nMints0;
  int *pStore_local;
  int nBytes_local;
  int iVar_local;
  word Truth_local;
  
  if (Truth == 0) {
    Truth_local._4_4_ = 0;
  }
  else if (Truth == 0xffffffffffffffff) {
    for (local_34 = 0; local_34 <= iVar; local_34 = local_34 + 1) {
      pStore[local_34] = nBytes * 4 + pStore[local_34];
    }
    Truth_local._4_4_ = nBytes << 3;
  }
  else if (nBytes == 1) {
    if (iVar != 2) {
      __assert_fail("iVar == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauCanon.c"
                    ,0x19c,"int Abc_TtCountOnesInCofsFast6_rec(word, int, int, int *)");
    }
    *pStore = Abc_TtCountOnesInCofsFast6_rec::bit_count[Truth & 0x55] + *pStore;
    pStore[1] = Abc_TtCountOnesInCofsFast6_rec::bit_count[Truth & 0x33] + pStore[1];
    pStore[2] = Abc_TtCountOnesInCofsFast6_rec::bit_count[Truth & 0xf] + pStore[2];
    Truth_local._4_4_ = Abc_TtCountOnesInCofsFast6_rec::bit_count[Truth & 0xff];
  }
  else {
    wVar3 = Abc_Tt6Cofactor0(Truth,iVar);
    iVar1 = Abc_TtCountOnesInCofsFast6_rec(wVar3,iVar + -1,nBytes / 2,pStore);
    wVar3 = Abc_Tt6Cofactor1(Truth,iVar);
    iVar2 = Abc_TtCountOnesInCofsFast6_rec(wVar3,iVar + -1,nBytes / 2,pStore);
    pStore[iVar] = iVar1 + pStore[iVar];
    Truth_local._4_4_ = iVar1 + iVar2;
  }
  return Truth_local._4_4_;
}

Assistant:

int Abc_TtCountOnesInCofsFast6_rec( word Truth, int iVar, int nBytes, int * pStore )
{
    static int bit_count[256] = {
      0,1,1,2,1,2,2,3,1,2,2,3,2,3,3,4,1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,
      1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
      1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
      2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
      1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
      2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
      2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
      3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,4,5,5,6,5,6,6,7,5,6,6,7,6,7,7,8
    };
    int nMints0, nMints1;
    if ( Truth == 0 )
        return 0;
    if ( ~Truth == 0 )
    {
        int i;
        for ( i = 0; i <= iVar; i++ )
            pStore[i] += nBytes * 4;
        return nBytes * 8;
    }
    if ( nBytes == 1 )
    {
        assert( iVar == 2 );
        pStore[0] += bit_count[ Truth & 0x55 ];
        pStore[1] += bit_count[ Truth & 0x33 ];
        pStore[2] += bit_count[ Truth & 0x0F ];
        return bit_count[ Truth & 0xFF ];
    }
    nMints0 = Abc_TtCountOnesInCofsFast6_rec( Abc_Tt6Cofactor0(Truth, iVar), iVar - 1, nBytes/2, pStore );
    nMints1 = Abc_TtCountOnesInCofsFast6_rec( Abc_Tt6Cofactor1(Truth, iVar), iVar - 1, nBytes/2, pStore );
    pStore[iVar] += nMints0;
    return nMints0 + nMints1;
}